

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDynamicLoader.cxx
# Opt level: O0

void __thiscall
cmDynamicLoaderCache::CacheFile(cmDynamicLoaderCache *this,char *path,LibraryHandle *p)

{
  mapped_type pvVar1;
  LibraryHandle *ppvVar2;
  bool bVar3;
  mapped_type *ppvVar4;
  allocator local_49;
  key_type local_48;
  LibraryHandle local_28;
  LibraryHandle h;
  LibraryHandle *p_local;
  char *path_local;
  cmDynamicLoaderCache *this_local;
  
  h = p;
  p_local = (LibraryHandle *)path;
  path_local = (char *)this;
  bVar3 = GetCacheFile(this,path,&local_28);
  if (bVar3) {
    FlushCache(this,(char *)p_local);
  }
  ppvVar2 = p_local;
  pvVar1 = *h;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,(char *)ppvVar2,&local_49);
  ppvVar4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
            ::operator[](&this->CacheMap,&local_48);
  *ppvVar4 = pvVar1;
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  return;
}

Assistant:

void cmDynamicLoaderCache::CacheFile(const char* path,
  const cmsys::DynamicLoader::LibraryHandle& p)
{
  cmsys::DynamicLoader::LibraryHandle h;
  if ( this->GetCacheFile(path, h) )
    {
    this->FlushCache(path);
    }
  this->CacheMap[path] = p;
}